

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O2

bufptr __thiscall cornerstone::snapshot::serialize(snapshot *this)

{
  size_t sVar1;
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  ulong *in_RSI;
  bufptr bVar2;
  bufptr conf_buf;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> uStack_28;
  
  cluster_config::serialize((cluster_config *)&uStack_28);
  sVar1 = buffer::size(uStack_28._M_t.
                       super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>.
                       _M_t.
                       super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>
                       .super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
  buffer::alloc((buffer *)this,sVar1 + 0x18);
  buffer::put((buffer *)this->last_log_term_,*in_RSI);
  buffer::put((buffer *)this->last_log_term_,in_RSI[1]);
  buffer::put((buffer *)this->last_log_term_,in_RSI[2]);
  buffer::put((buffer *)this->last_log_term_,
              uStack_28._M_t.
              super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
              super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
              super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
  buffer::pos((buffer *)this->last_log_term_,0);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr(&uStack_28);
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar2._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)this;
  return (bufptr)bVar2._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr snapshot::serialize()
{
    bufptr conf_buf = last_config_->serialize();
    bufptr buf = buffer::alloc(conf_buf->size() + sz_ulong * 3);
    buf->put(last_log_idx_);
    buf->put(last_log_term_);
    buf->put(size_);
    buf->put(*conf_buf);
    buf->pos(0);
    return buf;
}